

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.cc
# Opt level: O0

char __thiscall avro::json::JsonParser::next(JsonParser *this)

{
  int iVar1;
  ssize_t sVar2;
  size_t in_RCX;
  void *__buf;
  int in_ESI;
  long in_RDI;
  char ch;
  undefined1 local_19;
  undefined1 local_9;
  
  if ((*(byte *)(in_RDI + 0x54) & 1) == 0) {
    local_19 = ' ';
  }
  else {
    local_19 = *(char *)(in_RDI + 0x55);
  }
  local_9 = local_19;
  while( true ) {
    iVar1 = isspace((int)local_9);
    if (iVar1 == 0) break;
    sVar2 = StreamReader::read((StreamReader *)(in_RDI + 0x58),in_ESI,__buf,in_RCX);
    local_9 = (char)sVar2;
  }
  *(undefined1 *)(in_RDI + 0x54) = 0;
  return local_9;
}

Assistant:

char JsonParser::next()
{
    char ch = hasNext ? nextChar : ' ';
    while (isspace(ch)) {
        ch = in_.read();
    }
    hasNext = false;
    return ch;
}